

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

void Llb_NonlinRecomputeScores(Llb_Mgr_t *p)

{
  Llb_Prt_t *pLVar1;
  Llb_Var_t *pLVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  
  for (lVar5 = 0; lVar5 < p->iPartFree; lVar5 = lVar5 + 1) {
    pLVar1 = p->pParts[lVar5];
    if (pLVar1 != (Llb_Prt_t *)0x0) {
      iVar3 = Cudd_DagSize(pLVar1->bFunc);
      pLVar1->nSize = iVar3;
    }
  }
  for (lVar5 = 0; lVar5 < p->nVars; lVar5 = lVar5 + 1) {
    pLVar2 = p->pVars[lVar5];
    if (pLVar2 != (Llb_Var_t *)0x0) {
      pLVar2->nScore = 0;
      iVar3 = 0;
      while( true ) {
        if (pLVar2->vParts->nSize <= iVar3) break;
        iVar4 = Vec_IntEntry(pLVar2->vParts,iVar3);
        pLVar2->nScore = pLVar2->nScore + p->pParts[iVar4]->nSize;
        iVar3 = iVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void Llb_NonlinRecomputeScores( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    Llb_MgrForEachPart( p, pPart, i )
        pPart->nSize = Cudd_DagSize(pPart->bFunc);
    Llb_MgrForEachVar( p, pVar, i )
    {
        pVar->nScore = 0;
        Llb_VarForEachPart( p, pVar, pPart, k )
            pVar->nScore += pPart->nSize;
    }
}